

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

void doh_probe_dtor(void *key,size_t klen,void *e)

{
  doh_request *doh_req;
  void *e_local;
  size_t klen_local;
  void *key_local;
  
  if (e != (void *)0x0) {
    curl_slist_free_all(*(curl_slist **)((long)e + 0x110));
    Curl_dyn_free((dynbuf *)((long)e + 0x118));
    (*Curl_cfree)(e);
  }
  return;
}

Assistant:

static void doh_probe_dtor(void *key, size_t klen, void *e)
{
  (void)key;
  (void)klen;
  if(e) {
    struct doh_request *doh_req = e;
    curl_slist_free_all(doh_req->req_hds);
    Curl_dyn_free(&doh_req->resp_body);
    free(e);
  }
}